

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefUse.cpp
# Opt level: O0

bool __thiscall
dg::LLVMDefUseAnalysis::runOnNode(LLVMDefUseAnalysis *this,LLVMNode *node,LLVMNode *param_3)

{
  bool bVar1;
  Value *this_00;
  ret_type val_00;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RSI;
  Value *in_RDI;
  Instruction *I;
  Value *val;
  
  this_00 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey(in_RSI);
  val_00 = llvm::dyn_cast<llvm::Instruction,llvm::Value>(in_RDI);
  if (val_00 != (ret_type)0x0) {
    handleOperands((Instruction *)param_3,(LLVMNode *)val);
  }
  bVar1 = dda::LLVMDataDependenceAnalysis::isUse
                    ((LLVMDataDependenceAnalysis *)this_00,(Value *)val_00);
  if (bVar1) {
    addDataDependencies(this,node);
  }
  return false;
}

Assistant:

bool LLVMDefUseAnalysis::runOnNode(LLVMNode *node, LLVMNode * /*prev*/) {
    Value *val = node->getKey();

    // just add direct def-use edges to every instruction
    if (auto *I = dyn_cast<Instruction>(val))
        handleOperands(I, node);

    if (RD->isUse(val)) {
        addDataDependencies(node);
    }

    // we will run only once
    return false;
}